

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator fmt::v7::
         vformat_to<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                   (iterator out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   args,locale_ref loc)

{
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *end;
  ulong uVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  bool bVar2;
  type tVar3;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *end_00;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *pfVar4;
  void *pvVar5;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *begin;
  size_t sVar6;
  size_t sVar7;
  buffer<char> *c;
  char *__src;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *pfVar8;
  ptrdiff_t _Num;
  ulong __n;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  h;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  float local_98;
  undefined4 uStack_94;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined1 local_88 [32];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  local_58;
  locale_ref local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_88._16_8_ = args.field_1;
  local_88._8_8_ = args.desc_;
  sVar6 = format_str.size_;
  begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
           *)format_str.data_;
  if ((sVar6 == 2) && (*(short *)begin == 0x7d7b)) {
    local_98 = 0.0;
    if ((long)local_88._8_8_ < 0) {
      if ((int)(type)args.desc_ < 1) {
        tVar3 = none_type;
      }
      else {
        sVar6 = (((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   *)local_88._16_8_)->field_0).string.size;
        local_98 = (float)(((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                             *)local_88._16_8_)->field_0).ulong_long_value;
        uStack_94 = (undefined4)
                    ((((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                        *)local_88._16_8_)->field_0).ulong_long_value >> 0x20);
        uStack_90 = (undefined2)sVar6;
        uStack_8e = (undefined6)(sVar6 >> 0x10);
        tVar3 = ((format_arg *)local_88._16_8_)->type_;
      }
    }
    else {
      tVar3 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar6 = (((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   *)local_88._16_8_)->field_0).string.size;
        local_98 = (float)(((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                             *)local_88._16_8_)->field_0).ulong_long_value;
        uStack_94 = (undefined4)
                    ((((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                        *)local_88._16_8_)->field_0).ulong_long_value >> 0x20);
        uStack_90 = (undefined2)sVar6;
        uStack_8e = (undefined6)(sVar6 >> 0x10);
      }
    }
    local_88._0_8_ = out.container;
    switch(tVar3) {
    case none_type:
      detail::error_handler::on_error((error_handler *)out.container,"argument not found");
    case int_type:
      local_88._0_8_ =
           detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      (int)local_98);
      break;
    case uint_type:
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      (uint)local_98);
      break;
    case long_long_type:
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      CONCAT44(uStack_94,local_98));
      break;
    case ulong_long_type:
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      CONCAT44(uStack_94,local_98));
      break;
    case int128_type:
      out_01.container._4_4_ = uStack_94;
      out_01.container._0_4_ = local_98;
      value_00._10_6_ = in_stack_ffffffffffffff62;
      value_00._0_10_ = in_stack_ffffffffffffff58;
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                     ((detail *)out.container,out_01,(__int128)value_00);
      break;
    case uint128_type:
      out_00.container._4_4_ = uStack_94;
      out_00.container._0_4_ = local_98;
      value._10_6_ = in_stack_ffffffffffffff62;
      value._0_10_ = in_stack_ffffffffffffff58;
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                     ((detail *)out.container,out_00,(unsigned___int128)value);
      break;
    case bool_type:
      __n = (ulong)((uint)local_98 & 1) ^ 5;
      sVar6 = (out.container)->size_;
      uVar1 = __n + sVar6;
      if ((out.container)->capacity_ < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container,uVar1);
      }
      __src = "false";
      if (((uint)local_98 & 1) != 0) {
        __src = "true";
      }
      (out.container)->size_ = uVar1;
      memcpy((out.container)->ptr_ + sVar6,__src,__n);
      break;
    case char_type:
      sVar6 = (out.container)->size_;
      uVar1 = sVar6 + 1;
      if ((out.container)->capacity_ < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container,uVar1);
      }
      (out.container)->size_ = uVar1;
      (out.container)->ptr_[sVar6] = local_98._0_1_;
      break;
    case float_type:
      local_88._0_8_ =
           detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,local_98);
      break;
    case double_type:
      local_88._0_8_ =
           detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      (double)CONCAT44(uStack_94,local_98));
      break;
    case last_numeric_type:
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      (longdouble)CONCAT28(uStack_90,CONCAT44(uStack_94,local_98)));
      break;
    case cstring_type:
      local_88._0_8_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      (char *)CONCAT44(uStack_94,local_98));
      break;
    case string_type:
      sVar7 = CONCAT62(uStack_8e,uStack_90);
      sVar6 = (out.container)->size_;
      uVar1 = sVar6 + sVar7;
      if ((out.container)->capacity_ < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container,uVar1);
      }
      (out.container)->size_ = uVar1;
      if (sVar7 != 0) {
        memmove((out.container)->ptr_ + sVar6,(void *)CONCAT44(uStack_94,local_98),sVar7);
      }
      break;
    case pointer_type:
      local_88._0_8_ =
           detail::
           write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      CONCAT44(uStack_94,local_98),(basic_format_specs<char> *)0x0);
      break;
    case custom_type:
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_88._24_8_ = loc.locale_;
      (*(code *)CONCAT62(uStack_8e,uStack_90))(CONCAT44(uStack_94,local_98),&local_48,local_88);
      break;
    default:
      detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/format.h"
                          ,0x6bf,"");
    }
  }
  else {
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    end = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
           *)(&begin->field_0x0 + sVar6);
    local_68.container = out.container;
    local_60 = (char *)local_88._8_8_;
    local_58 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
                )local_88._16_8_;
    local_50.locale_ = loc.locale_;
    if ((long)sVar6 < 0x20) {
      pfVar4 = begin;
      if (sVar6 != 0) {
        pfVar8 = begin;
        do {
          local_88._16_8_ = sVar6;
          local_88._8_8_ = pfVar4;
          end_00 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    *)&pfVar8->field_0x1;
          if (*(char *)pfVar8 == '}') {
            if ((end_00 == end) || (*(char *)end_00 != '}')) {
LAB_0011152d:
              detail::error_handler::on_error
                        ((error_handler *)out.container,"unmatched \'}\' in format string");
            }
            out.container = (buffer<char> *)local_88;
            detail::
            format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)local_88,(char *)begin,(char *)end_00);
            end_00 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                      *)&pfVar8->field_0x2;
            begin = end_00;
          }
          else if (*(char *)pfVar8 == '{') {
            detail::
            format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)local_88,(char *)begin,(char *)pfVar8);
            end_00 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                      *)detail::
                        parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                                  ((char *)pfVar8,(char *)end,
                                   (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                                    *)local_88);
            out.container = (buffer<char> *)pfVar8;
            begin = end_00;
          }
          pfVar8 = end_00;
          pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    *)local_88._8_8_;
          sVar6 = local_88._16_8_;
        } while (end_00 != end);
      }
      local_88._16_8_ = sVar6;
      local_88._8_8_ = pfVar4;
      detail::
      format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *)local_88,(char *)begin,(char *)end);
      local_88._0_8_ = local_68.container;
    }
    else {
      pfVar4 = begin;
      do {
        local_88._16_8_ = sVar6;
        local_88._8_8_ = pfVar4;
        if (begin == end) {
          return (iterator)local_68.container;
        }
        pfVar4 = begin;
        if (*(char *)begin == '{') {
LAB_00111220:
          if (begin != pfVar4) {
            do {
              if ((long)pfVar4 - (long)begin < 0) goto LAB_00111539;
              out.container = (buffer<char> *)begin;
              pvVar5 = memchr(begin,0x7d,(long)pfVar4 - (long)begin);
              if (pvVar5 == (void *)0x0) {
                detail::
                format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                           *)local_88,(char *)begin,(char *)pfVar4);
              }
              else {
                pfVar8 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                          *)((long)pvVar5 + 1);
                if ((pfVar8 == pfVar4) || (*(char *)pfVar8 != '}')) goto LAB_0011152d;
                detail::
                format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                           *)local_88,(char *)begin,(char *)pfVar8);
                begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                         *)((long)pvVar5 + 2);
              }
            } while (pvVar5 != (void *)0x0);
          }
          begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   *)detail::
                     parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                               ((char *)pfVar4,(char *)end,
                                (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                                 *)local_88);
          bVar2 = true;
        }
        else {
          sVar7 = (long)end - (long)&begin->field_0x1;
          if ((long)sVar7 < 0) {
LAB_00111539:
            detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/core.h"
                                ,0x13d,"negative value");
          }
          pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    *)memchr(&begin->field_0x1,0x7b,sVar7);
          pfVar8 = begin;
          if (pfVar4 != (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                         *)0x0) goto LAB_00111220;
          do {
            if ((long)end - (long)pfVar8 < 0) goto LAB_00111539;
            out.container = (buffer<char> *)pfVar8;
            pvVar5 = memchr(pfVar8,0x7d,(long)end - (long)pfVar8);
            if (pvVar5 == (void *)0x0) {
              detail::
              format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
              ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                         *)local_88,(char *)pfVar8,(char *)end);
            }
            else {
              pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                        *)((long)pvVar5 + 1);
              if ((pfVar4 == end) || (*(char *)pfVar4 != '}')) goto LAB_0011152d;
              detail::
              format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
              ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                         *)local_88,(char *)pfVar8,(char *)pfVar4);
              pfVar8 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                        *)((long)pvVar5 + 2);
            }
          } while (pvVar5 != (void *)0x0);
          bVar2 = false;
        }
        local_88._0_8_ = local_68.container;
        pfVar4 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *)local_88._8_8_;
        sVar6 = local_88._16_8_;
      } while (bVar2);
    }
  }
  return (iterator)(buffer<char> *)local_88._0_8_;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}